

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::tcShiftRight(WordType *Dst,uint Words,uint Count)

{
  uint uVar1;
  uint *puVar2;
  sbyte sVar3;
  uint local_2c;
  uint i;
  uint WordsToMove;
  uint BitShift;
  uint local_18;
  uint WordShift;
  uint Count_local;
  uint Words_local;
  WordType *Dst_local;
  
  if (Count != 0) {
    WordsToMove = Count >> 6;
    local_18 = Count;
    WordShift = Words;
    _Count_local = Dst;
    puVar2 = std::min<unsigned_int>(&WordsToMove,&WordShift);
    BitShift = *puVar2;
    uVar1 = WordShift - BitShift;
    if ((local_18 & 0x3f) == 0) {
      memmove(_Count_local,_Count_local + BitShift,(ulong)(uVar1 * 8));
    }
    else {
      for (local_2c = 0; local_2c != uVar1; local_2c = local_2c + 1) {
        sVar3 = (sbyte)(local_18 & 0x3f);
        _Count_local[local_2c] = _Count_local[local_2c + BitShift] >> sVar3;
        if (local_2c + 1 != uVar1) {
          _Count_local[local_2c] =
               _Count_local[local_2c + BitShift + 1] << (0x40U - sVar3 & 0x3f) |
               _Count_local[local_2c];
        }
      }
    }
    memset(_Count_local + uVar1,0,(ulong)(BitShift << 3));
  }
  return;
}

Assistant:

void APInt::tcShiftRight(WordType *Dst, unsigned Words, unsigned Count) {
  // Don't bother performing a no-op shift.
  if (!Count)
    return;

  // WordShift is the inter-part shift; BitShift is the intra-part shift.
  unsigned WordShift = std::min(Count / APINT_BITS_PER_WORD, Words);
  unsigned BitShift = Count % APINT_BITS_PER_WORD;

  unsigned WordsToMove = Words - WordShift;
  // Fastpath for moving by whole words.
  if (BitShift == 0) {
    std::memmove(Dst, Dst + WordShift, WordsToMove * APINT_WORD_SIZE);
  } else {
    for (unsigned i = 0; i != WordsToMove; ++i) {
      Dst[i] = Dst[i + WordShift] >> BitShift;
      if (i + 1 != WordsToMove)
        Dst[i] |= Dst[i + WordShift + 1] << (APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder with 0s.
  std::memset(Dst + WordsToMove, 0, WordShift * APINT_WORD_SIZE);
}